

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

size_t __thiscall sentencepiece::SelfTestData_Sample::ByteSizeLong(SelfTestData_Sample *this)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  long in_RDI;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  SelfTestData_Sample *in_stack_ffffffffffffff90;
  size_t local_58;
  
  local_58 = 0;
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_input_abi_cxx11_
                ((SelfTestData_Sample *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      local_58 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x45e740);
      local_58 = local_58 + 1;
    }
    if ((uVar1 & 2) != 0) {
      _internal_expected_abi_cxx11_
                ((SelfTestData_Sample *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      sVar2 = google::protobuf::internal::WireFormatLite::StringSize((string *)0x45e76c);
      local_58 = sVar2 + 1 + local_58;
    }
  }
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1) {
    in_stack_ffffffffffffff90 = (SelfTestData_Sample *)(in_RDI + 8);
    if (((uint)(in_stack_ffffffffffffff90->super_MessageLite)._vptr_MessageLite & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                ((InternalMetadata *)in_stack_ffffffffffffff90);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar3 = std::__cxx11::string::size();
    local_58 = lVar3 + local_58;
  }
  google::protobuf::internal::ToCachedSize(local_58);
  SetCachedSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  return local_58;
}

Assistant:

size_t SelfTestData_Sample::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.SelfTestData.Sample)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string input = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input());
    }

    // optional string expected = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_expected());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}